

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl.cpp
# Opt level: O3

bool ImGui_ImplGlfwGL3_Init(GLFWwindow *window,bool install_callbacks,char *glsl_version)

{
  size_t sVar1;
  ImGuiIO *pIVar2;
  char *__s;
  
  g_Time = 0.0;
  __s = "#version 150";
  if (glsl_version != (char *)0x0) {
    __s = glsl_version;
  }
  g_Window = window;
  sVar1 = strlen(__s);
  if ((int)sVar1 < 0x1e) {
    strcpy(g_GlslVersion,__s);
    sVar1 = strlen(g_GlslVersion);
    (g_GlslVersion + sVar1)[0] = '\n';
    (g_GlslVersion + sVar1)[1] = '\0';
    pIVar2 = ImGui::GetIO();
    *(byte *)&pIVar2->BackendFlags = (byte)pIVar2->BackendFlags | 6;
    pIVar2->KeyMap[0] = 0x102;
    pIVar2->KeyMap[1] = 0x107;
    pIVar2->KeyMap[2] = 0x106;
    pIVar2->KeyMap[3] = 0x109;
    pIVar2->KeyMap[4] = 0x108;
    pIVar2->KeyMap[5] = 0x10a;
    pIVar2->KeyMap[6] = 0x10b;
    pIVar2->KeyMap[7] = 0x10c;
    pIVar2->KeyMap[8] = 0x10d;
    pIVar2->KeyMap[9] = 0x104;
    pIVar2->KeyMap[10] = 0x105;
    pIVar2->KeyMap[0xb] = 0x103;
    pIVar2->KeyMap[0xc] = 0x20;
    pIVar2->KeyMap[0xd] = 0x101;
    pIVar2->KeyMap[0xe] = 0x100;
    pIVar2->KeyMap[0xf] = 0x41;
    pIVar2->KeyMap[0x10] = 0x43;
    pIVar2->KeyMap[0x11] = 0x56;
    pIVar2->KeyMap[0x12] = 0x58;
    pIVar2->KeyMap[0x13] = 0x59;
    pIVar2->KeyMap[0x14] = 0x5a;
    pIVar2->SetClipboardTextFn = ImGui_ImplGlfwGL3_SetClipboardText;
    pIVar2->GetClipboardTextFn = ImGui_ImplGlfwGL3_GetClipboardText;
    pIVar2->ClipboardUserData = g_Window;
    g_MouseCursors[0] = glfwCreateStandardCursor(0x36001);
    g_MouseCursors[1] = glfwCreateStandardCursor(0x36002);
    g_MouseCursors[2] = glfwCreateStandardCursor(0x36001);
    g_MouseCursors[3] = glfwCreateStandardCursor(0x36006);
    g_MouseCursors[4] = glfwCreateStandardCursor(0x36005);
    g_MouseCursors[5] = glfwCreateStandardCursor(0x36001);
    g_MouseCursors[6] = glfwCreateStandardCursor(0x36001);
    if (install_callbacks) {
      glfwSetMouseButtonCallback(window,ImGui_ImplGlfw_MouseButtonCallback);
      glfwSetScrollCallback(window,ImGui_ImplGlfw_ScrollCallback);
      glfwSetKeyCallback(window,ImGui_ImplGlfw_KeyCallback);
      glfwSetCharCallback(window,ImGui_ImplGlfw_CharCallback);
    }
    return true;
  }
  __assert_fail("(int)strlen(glsl_version) + 2 < ((int)(sizeof(g_GlslVersion)/sizeof(*g_GlslVersion)))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/imgui/imgui_impl.cpp"
                ,0x16d,"bool ImGui_ImplGlfwGL3_Init(GLFWwindow *, bool, const char *)");
}

Assistant:

bool    ImGui_ImplGlfwGL3_Init(GLFWwindow* window, bool install_callbacks, const char* glsl_version)
{
    g_Window = window;
    g_Time = 0.0;

    // Store GLSL version string so we can refer to it later in case we recreate shaders. Note: GLSL version is NOT the same as GL version. Leave this to NULL if unsure.
    if (glsl_version == NULL)
        glsl_version = "#version 150";
    IM_ASSERT((int)strlen(glsl_version) + 2 < IM_ARRAYSIZE(g_GlslVersion));
    strcpy(g_GlslVersion, glsl_version);
    strcat(g_GlslVersion, "\n");

    // Setup back-end capabilities flags
    ImGuiIO& io = ImGui::GetIO();
    io.BackendFlags |= ImGuiBackendFlags_HasMouseCursors;   // We can honor GetMouseCursor() values (optional)
    io.BackendFlags |= ImGuiBackendFlags_HasSetMousePos;    // We can honor io.WantSetMousePos requests (optional, rarely used)

    // Keyboard mapping. ImGui will use those indices to peek into the io.KeysDown[] array.
    io.KeyMap[ImGuiKey_Tab] = GLFW_KEY_TAB;
    io.KeyMap[ImGuiKey_LeftArrow] = GLFW_KEY_LEFT;
    io.KeyMap[ImGuiKey_RightArrow] = GLFW_KEY_RIGHT;
    io.KeyMap[ImGuiKey_UpArrow] = GLFW_KEY_UP;
    io.KeyMap[ImGuiKey_DownArrow] = GLFW_KEY_DOWN;
    io.KeyMap[ImGuiKey_PageUp] = GLFW_KEY_PAGE_UP;
    io.KeyMap[ImGuiKey_PageDown] = GLFW_KEY_PAGE_DOWN;
    io.KeyMap[ImGuiKey_Home] = GLFW_KEY_HOME;
    io.KeyMap[ImGuiKey_End] = GLFW_KEY_END;
    io.KeyMap[ImGuiKey_Insert] = GLFW_KEY_INSERT;
    io.KeyMap[ImGuiKey_Delete] = GLFW_KEY_DELETE;
    io.KeyMap[ImGuiKey_Backspace] = GLFW_KEY_BACKSPACE;
    io.KeyMap[ImGuiKey_Space] = GLFW_KEY_SPACE;
    io.KeyMap[ImGuiKey_Enter] = GLFW_KEY_ENTER;
    io.KeyMap[ImGuiKey_Escape] = GLFW_KEY_ESCAPE;
    io.KeyMap[ImGuiKey_A] = GLFW_KEY_A;
    io.KeyMap[ImGuiKey_C] = GLFW_KEY_C;
    io.KeyMap[ImGuiKey_V] = GLFW_KEY_V;
    io.KeyMap[ImGuiKey_X] = GLFW_KEY_X;
    io.KeyMap[ImGuiKey_Y] = GLFW_KEY_Y;
    io.KeyMap[ImGuiKey_Z] = GLFW_KEY_Z;

    io.SetClipboardTextFn = ImGui_ImplGlfwGL3_SetClipboardText;
    io.GetClipboardTextFn = ImGui_ImplGlfwGL3_GetClipboardText;
    io.ClipboardUserData = g_Window;
#ifdef _WIN32
    io.ImeWindowHandle = glfwGetWin32Window(g_Window);
#endif

    // Load cursors
    // FIXME: GLFW doesn't expose suitable cursors for ResizeAll, ResizeNESW, ResizeNWSE. We revert to arrow cursor for those.
    g_MouseCursors[ImGuiMouseCursor_Arrow] = glfwCreateStandardCursor(GLFW_ARROW_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_TextInput] = glfwCreateStandardCursor(GLFW_IBEAM_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_ResizeAll] = glfwCreateStandardCursor(GLFW_ARROW_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_ResizeNS] = glfwCreateStandardCursor(GLFW_VRESIZE_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_ResizeEW] = glfwCreateStandardCursor(GLFW_HRESIZE_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_ResizeNESW] = glfwCreateStandardCursor(GLFW_ARROW_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_ResizeNWSE] = glfwCreateStandardCursor(GLFW_ARROW_CURSOR);

    if (install_callbacks)
        ImGui_ImplGlfw_InstallCallbacks(window);

    return true;
}